

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,ShaderImageLoadStoreBase *this,Vector<int,_4> *v)

{
  int *piVar1;
  ostream *poVar2;
  char *pcVar3;
  int local_1a8;
  int i;
  undefined1 local_198 [8];
  ostringstream s;
  Vector<int,_4> *v_local;
  ShaderImageLoadStoreBase *this_local;
  
  s._368_8_ = v;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"[");
  for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
    piVar1 = tcu::Vector<int,_4>::operator[](v,local_1a8);
    poVar2 = (ostream *)std::ostream::operator<<(local_198,*piVar1);
    pcVar3 = ",";
    if (local_1a8 == 3) {
      pcVar3 = "";
    }
    std::operator<<(poVar2,pcVar3);
  }
  std::operator<<((ostream *)local_198,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T v)
	{
		std::ostringstream s;
		s << "[";
		for (int i = 0; i < 4; ++i)
			s << v[i] << (i == 3 ? "" : ",");
		s << "]";
		return s.str();
	}